

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall flatbuffers::Parser::SetRootType(Parser *this,char *name)

{
  Namespace *this_00;
  StructDef *pSVar1;
  bool bVar2;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,name,(allocator<char> *)&local_38);
  pSVar1 = LookupStruct(this,&local_58);
  this->root_struct_def_ = pSVar1;
  std::__cxx11::string::~string((string *)&local_58);
  bVar2 = true;
  if (this->root_struct_def_ == (StructDef *)0x0) {
    this_00 = this->current_namespace_;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_59);
    Namespace::GetFullyQualifiedName(&local_58,this_00,&local_38,1000);
    pSVar1 = LookupStruct(this,&local_58);
    this->root_struct_def_ = pSVar1;
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    bVar2 = this->root_struct_def_ != (StructDef *)0x0;
  }
  return bVar2;
}

Assistant:

bool Parser::SetRootType(const char *name) {
  root_struct_def_ = LookupStruct(name);
  if (!root_struct_def_)
    root_struct_def_ =
        LookupStruct(current_namespace_->GetFullyQualifiedName(name));
  return root_struct_def_ != nullptr;
}